

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::DeleteProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  byte bVar1;
  ScriptContext *this_00;
  code *pcVar2;
  bool bVar3;
  uint32 in_EAX;
  BOOL BVar4;
  BOOL BVar5;
  int iVar6;
  PropertyRecord *pPVar7;
  undefined4 *puVar8;
  DynamicTypeHandler *this_01;
  uint uVar9;
  uint uVar10;
  ushort in_R10W;
  uint32 local_38;
  PropertyOperationFlags local_34;
  uint32 indexVal;
  
  iVar6 = this->propertyCount;
  bVar3 = 0 < iVar6;
  if (0 < iVar6) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyId) {
      bVar3 = true;
      in_R10W = 0;
    }
    else {
      uVar10 = 1;
      do {
        in_R10W = (ushort)uVar10;
        uVar9 = uVar10 & 0xffff;
        bVar3 = (int)uVar9 < iVar6;
        if (iVar6 <= (int)uVar9) break;
        uVar10 = uVar9 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar9 << 4)) + 8) !=
               propertyId);
    }
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  if (bVar3) {
    bVar1 = this->descriptors[in_R10W].field_1.Attributes;
    if ((bVar1 & 8) == 0) {
      if ((bVar1 & 2) == 0) {
        pPVar7 = ScriptContext::GetPropertyName(this_00,propertyId);
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                  (propertyOperationFlags,this_00,(PCWSTR)(pPVar7 + 1));
        BVar5 = 0;
      }
      else {
        if ((((this->super_DynamicTypeHandler).flags & 0x20) != 0) ||
           (BVar5 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                              (&instance->super_RecyclableObject,propertyId), BVar5 != 0)) {
          ScriptContext::InvalidateProtoCaches(this_00,propertyId);
        }
        DynamicObject::ChangeType(instance);
        DynamicTypeHandler::SetSlotUnchecked(instance,(uint)in_R10W,(Var)0x0);
        if (((this->super_DynamicTypeHandler).flags & 0x20) == 0) {
          this_01 = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
        }
        else {
          this_01 = (DynamicTypeHandler *)NullTypeHandler<true>::GetDefaultInstance();
        }
        iVar6 = (*(instance->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(instance);
        if ((char)iVar6 != '\0') {
          DynamicTypeHandler::SetHasOnlyWritableDataProperties(this_01,false);
        }
        DynamicTypeHandler::SetInstanceTypeHandler(instance,this_01,false);
        BVar5 = 1;
      }
    }
    else {
      BVar5 = 1;
      if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x298,"(!GetIsLocked())","!GetIsLocked()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
    }
  }
  else {
    local_38 = in_EAX;
    local_34 = propertyOperationFlags;
    bVar3 = DynamicObject::HasObjectArray(instance);
    BVar5 = 1;
    if ((bVar3) &&
       (BVar4 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_38), BVar4 != 0)) {
      BVar5 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,local_38,local_34);
    }
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                return true;
            }
            if (!(descriptors[index].Attributes & PropertyConfigurable))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, scriptContext->GetPropertyName(propertyId)->GetBuffer());

                return false;
            }

            if ((this->GetFlags() & IsPrototypeFlag)
                || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
            {
                // We don't evolve dictionary types when deleting a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.)
                scriptContext->InvalidateProtoCaches(propertyId);
            }

            instance->ChangeType();


            CompileAssert(_countof(descriptors) == size);
            if (size > 1)
            {
                if (GetIsLocked())
                {
                    // Prevent conversion to path type and then dictionary. Remove this when path types support deleted properties.
                    this->ConvertToNonSharedSimpleType(instance)->SetAttribute(instance, index, PropertyDeleted);
                }
                else
                {
                    SetAttribute(instance, index, PropertyDeleted);
                }
            }
            else
            {
                SetSlotUnchecked(instance, index, nullptr);

                NullTypeHandlerBase* nullTypeHandler = ((this->GetFlags() & IsPrototypeFlag) != 0) ?
                    (NullTypeHandlerBase*)NullTypeHandler<true>::GetDefaultInstance() : (NullTypeHandlerBase*)NullTypeHandler<false>::GetDefaultInstance();
                if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
                {
                    nullTypeHandler->ClearHasOnlyWritableDataProperties();
                }
                SetInstanceTypeHandler(instance, nullTypeHandler, false);
            }

            return true;
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::DeleteItem(instance, indexVal, propertyOperationFlags);
        }

        return true;
    }